

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

_Bool invoke_message_callback
                (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData,IOTHUB_MESSAGE_HANDLE messageHandle)

{
  CALLBACK_TYPE CVar1;
  IOTHUBMESSAGE_DISPOSITION_RESULT IVar2;
  IOTHUB_CLIENT_RESULT IVar3;
  time_t tVar4;
  LOGGER_LOG p_Var5;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  IOTHUBMESSAGE_DISPOSITION_RESULT cb_result;
  LOGGER_LOG l;
  _Bool result;
  IOTHUB_MESSAGE_HANDLE messageHandle_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData_local;
  
  tVar4 = get_time((time_t *)0x0);
  handleData->lastMessageReceiveTime = tVar4;
  CVar1 = (handleData->messageCallback).type;
  if (CVar1 == CALLBACK_TYPE_NONE) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"invoke_message_callback",0x1d8,1,
                "Invalid workflow - not currently set up to accept messages");
    }
    l._7_1_ = false;
  }
  else if (CVar1 == CALLBACK_TYPE_MESSAGE_SYNC) {
    IVar2 = (*(handleData->messageCallback).callbackSync)
                      (messageHandle,(handleData->messageCallback).userContextCallback);
    if (((IVar2 != IOTHUBMESSAGE_ASYNC_ACK) &&
        (IVar3 = (*handleData->IoTHubTransport_SendMessageDisposition)
                           (handleData->deviceHandle,messageHandle,IVar2), IVar3 != IOTHUB_CLIENT_OK
        )) && (p_Var5 = xlogging_get_log_function(), p_Var5 != (LOGGER_LOG)0x0)) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"invoke_message_callback",0x1e4,1,"IoTHubTransport_SendMessageDisposition failed");
    }
    l._7_1_ = true;
  }
  else if (CVar1 == CALLBACK_TYPE_MESSAGE_ASYNC) {
    l._7_1_ = (*(handleData->messageCallback).callbackAsync)
                        (messageHandle,(handleData->messageCallback).userContextCallback);
    if ((!l._7_1_) && (p_Var5 = xlogging_get_log_function(), p_Var5 != (LOGGER_LOG)0x0)) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"invoke_message_callback",0x1f0,1,"messageCallbackEx failed");
    }
  }
  else {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"invoke_message_callback",0x1f6,1,"Invalid state");
    }
    l._7_1_ = false;
  }
  return l._7_1_;
}

Assistant:

static bool invoke_message_callback(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData, IOTHUB_MESSAGE_HANDLE messageHandle)
{
    bool result;
    handleData->lastMessageReceiveTime = get_time(NULL);

    switch (handleData->messageCallback.type)
    {
        case CALLBACK_TYPE_NONE:
        {
            LogError("Invalid workflow - not currently set up to accept messages");
            result = false;
            break;
        }
        case CALLBACK_TYPE_MESSAGE_SYNC:
        {
            IOTHUBMESSAGE_DISPOSITION_RESULT cb_result = handleData->messageCallback.callbackSync(messageHandle, handleData->messageCallback.userContextCallback);

            if (cb_result != IOTHUBMESSAGE_ASYNC_ACK)
            {
                if (handleData->IoTHubTransport_SendMessageDisposition(handleData->deviceHandle, messageHandle, cb_result) != IOTHUB_CLIENT_OK)
                {
                    LogError("IoTHubTransport_SendMessageDisposition failed");
                }
            }

            result = true;
            break;
        }
        case CALLBACK_TYPE_MESSAGE_ASYNC:
        {
            result = handleData->messageCallback.callbackAsync(messageHandle, handleData->messageCallback.userContextCallback);
            if (!result)
            {
                LogError("messageCallbackEx failed");
            }
            break;
        }
        default:
        {
            LogError("Invalid state");
            result = false;
            break;
        }
    }

    return result;
}